

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mfc0(DisasContext_conflict6 *ctx,TCGv_i64 arg,int reg,int sel)

{
  TCGContext_conflict6 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i32 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 tmp_2;
  TCGv_i32 helper_tmp_1;
  TCGv_i32 helper_tmp;
  TCGv_i64 tmp_1;
  TCGv_i64 tmp;
  TCGContext_conflict6 *tcg_ctx;
  int sel_local;
  int reg_local;
  TCGv_i64 arg_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (sel != 0) {
    check_insn(ctx,0x20);
  }
  switch(reg) {
  case 0:
    switch(sel) {
    case 0:
      gen_mfc0_load32(tcg_ctx_00,arg,0x574);
      return;
    case 1:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_helper_mfc0_mvpcontrol(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
        return;
      }
      break;
    case 2:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_helper_mfc0_mvpconf0(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
        return;
      }
      break;
    case 3:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_helper_mfc0_mvpconf1(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
        return;
      }
      break;
    case 4:
      if ((ctx->vp & 1U) != 0) {
        gen_mfc0_load32(tcg_ctx_00,arg,0x578);
        return;
      }
    }
    break;
  case 1:
    switch(sel) {
    case 0:
      if ((ctx->insn_flags & 0x2000) == 0) {
        gen_helper_mfc0_random(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
        return;
      }
      break;
    case 1:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_mfc0_load32(tcg_ctx_00,arg,0x580);
        return;
      }
      break;
    case 2:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_mfc0_load32(tcg_ctx_00,arg,0x584);
        return;
      }
      break;
    case 3:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_mfc0_load32(tcg_ctx_00,arg,0x588);
        return;
      }
      break;
    case 4:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_mfc0_load64(tcg_ctx_00,arg,0x590);
        return;
      }
      break;
    case 5:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_mfc0_load64(tcg_ctx_00,arg,0x598);
        return;
      }
      break;
    case 6:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_mfc0_load64(tcg_ctx_00,arg,0x5a0);
        return;
      }
      break;
    case 7:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_mfc0_load32(tcg_ctx_00,arg,0x5a8);
        return;
      }
    }
    break;
  case 2:
    switch(sel) {
    case 0:
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_ld_i64_mips64el(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_env,0x5b0);
      if ((ctx->rxi & 1U) != 0) {
        tcg_gen_shri_i64_mips64el(tcg_ctx_00,arg,pTVar3,0x3e);
        tcg_gen_deposit_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,arg,0x1e,2);
      }
      gen_move_low32(tcg_ctx_00,arg,pTVar3);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      return;
    case 1:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_helper_mfc0_tcstatus(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
        return;
      }
      break;
    case 2:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_helper_mfc0_tcbind(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
        return;
      }
      break;
    case 3:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_helper_mfc0_tcrestart(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
        return;
      }
      break;
    case 4:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_helper_mfc0_tchalt(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
        return;
      }
      break;
    case 5:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_helper_mfc0_tccontext(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
        return;
      }
      break;
    case 6:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_helper_mfc0_tcschedule(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
        return;
      }
      break;
    case 7:
      if ((ctx->insn_flags & 0x4000000000) != 0) {
        gen_helper_mfc0_tcschefback(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
        return;
      }
    }
    break;
  case 3:
    if (sel == 0) {
      pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
      tcg_gen_ld_i64_mips64el(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_env,0x5b8);
      if ((ctx->rxi & 1U) != 0) {
        tcg_gen_shri_i64_mips64el(tcg_ctx_00,arg,pTVar3,0x3e);
        tcg_gen_deposit_i64_mips64el(tcg_ctx_00,pTVar3,pTVar3,arg,0x1e,2);
      }
      gen_move_low32(tcg_ctx_00,arg,pTVar3);
      tcg_temp_free_i64(tcg_ctx_00,pTVar3);
      return;
    }
    if ((sel == 1) && ((ctx->vp & 1U) != 0)) {
      gen_mfc0_load32(tcg_ctx_00,arg,0x5c0);
      return;
    }
    break;
  case 4:
    switch(sel) {
    case 0:
      tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,0x5c8);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
      return;
    case 1:
      break;
    case 2:
      if ((ctx->ulri & 1U) != 0) {
        tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,0x1a0);
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
        return;
      }
      break;
    default:
      break;
    case 5:
      if ((ctx->mi & 1U) != 0) {
        gen_helper_mtc0_memorymapid(tcg_ctx_00,tcg_ctx_00->cpu_env,arg);
        return;
      }
    }
    break;
  case 5:
    switch(sel) {
    case 0:
      gen_mfc0_load32(tcg_ctx_00,arg,0x5d4);
      return;
    case 1:
      check_insn(ctx,0x40);
      gen_mfc0_load32(tcg_ctx_00,arg,0x5dc);
      return;
    case 2:
      if ((ctx->sc & 1U) != 0) {
        tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,0x5e0);
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
        return;
      }
      break;
    case 3:
      if ((ctx->sc & 1U) != 0) {
        tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,0x5e8);
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
        return;
      }
      break;
    case 4:
      if ((ctx->sc & 1U) != 0) {
        tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,0x5f0);
        tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
        return;
      }
      break;
    case 5:
      check_pw(ctx);
      gen_mfc0_load32(tcg_ctx_00,arg,0x5f8);
      return;
    case 6:
      check_pw(ctx);
      gen_mfc0_load32(tcg_ctx_00,arg,0x600);
      return;
    case 7:
      check_pw(ctx);
      gen_mfc0_load32(tcg_ctx_00,arg,0x608);
      return;
    }
    break;
  case 6:
    switch(sel) {
    case 0:
      gen_mfc0_load32(tcg_ctx_00,arg,0x610);
      return;
    case 1:
      check_insn(ctx,0x40);
      gen_mfc0_load32(tcg_ctx_00,arg,0x61c);
      return;
    case 2:
      check_insn(ctx,0x40);
      gen_mfc0_load32(tcg_ctx_00,arg,0x624);
      return;
    case 3:
      check_insn(ctx,0x40);
      gen_mfc0_load32(tcg_ctx_00,arg,0x62c);
      return;
    case 4:
      check_insn(ctx,0x40);
      gen_mfc0_load32(tcg_ctx_00,arg,0x634);
      return;
    case 5:
      check_insn(ctx,0x40);
      gen_mfc0_load32(tcg_ctx_00,arg,0x63c);
      return;
    case 6:
      check_pw(ctx);
      gen_mfc0_load32(tcg_ctx_00,arg,0x614);
      return;
    }
    break;
  case 7:
    if (sel == 0) {
      check_insn(ctx,0x40);
      gen_mfc0_load32(tcg_ctx_00,arg,0x640);
      return;
    }
    break;
  case 8:
    switch(sel) {
    case 0:
      tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,0x648);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
      return;
    case 1:
      if ((ctx->bi & 1U) != 0) {
        gen_mfc0_load32(tcg_ctx_00,arg,0x650);
        return;
      }
      break;
    case 2:
      if ((ctx->bp & 1U) != 0) {
        gen_mfc0_load32(tcg_ctx_00,arg,0x654);
        return;
      }
      break;
    case 3:
      if ((ctx->bi & 1U) != 0) {
        gen_mfc0_load32(tcg_ctx_00,arg,0x658);
        tcg_gen_andi_i64_mips64el(tcg_ctx_00,arg,arg,-0x10000);
        return;
      }
    }
    break;
  case 9:
    if (sel == 0) {
      uVar1 = tb_cflags((ctx->base).tb);
      if ((uVar1 & 0x20000) != 0) {
        gen_io_start(tcg_ctx_00);
      }
      gen_helper_mfc0_count(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
      gen_save_pc(tcg_ctx_00,(ctx->base).pc_next + 4);
      (ctx->base).is_jmp = DISAS_TARGET_1;
      return;
    }
    if (sel == 6) {
      if ((ctx->saar & 1U) != 0) {
        gen_mfc0_load32(tcg_ctx_00,arg,0x660);
        return;
      }
    }
    else if ((sel == 7) && ((ctx->saar & 1U) != 0)) {
      gen_helper_mfc0_saar(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
      return;
    }
    break;
  case 10:
    if (sel == 0) {
      tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,0x678);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
      return;
    }
    break;
  case 0xb:
    if (sel == 0) {
      gen_mfc0_load32(tcg_ctx_00,arg,0x688);
      return;
    }
    break;
  case 0xc:
    switch(sel) {
    case 0:
      gen_mfc0_load32(tcg_ctx_00,arg,0x68c);
      return;
    case 1:
      check_insn(ctx,0x40);
      gen_mfc0_load32(tcg_ctx_00,arg,0x690);
      return;
    case 2:
      check_insn(ctx,0x40);
      gen_mfc0_load32(tcg_ctx_00,arg,0x694);
      return;
    case 3:
      check_insn(ctx,0x40);
      gen_mfc0_load32(tcg_ctx_00,arg,0x698);
      return;
    }
    break;
  case 0xd:
    if (sel == 0) {
      gen_mfc0_load32(tcg_ctx_00,arg,0x69c);
      return;
    }
    break;
  case 0xe:
    if (sel == 0) {
      tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,0x6a0);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
      return;
    }
    break;
  case 0xf:
    if (sel == 0) {
      gen_mfc0_load32(tcg_ctx_00,arg,0x6a8);
      return;
    }
    if (sel == 1) {
      check_insn(ctx,0x40);
      tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,0x6b0);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
      return;
    }
    if ((sel == 3) && (check_insn(ctx,0x40), (ctx->cmgcr & 1U) != 0)) {
      tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,0x6c0);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
      return;
    }
    break;
  case 0x10:
    switch(sel) {
    case 0:
      gen_mfc0_load32(tcg_ctx_00,arg,0x6c8);
      return;
    case 1:
      gen_mfc0_load32(tcg_ctx_00,arg,0x6cc);
      return;
    case 2:
      gen_mfc0_load32(tcg_ctx_00,arg,0x6d0);
      return;
    case 3:
      gen_mfc0_load32(tcg_ctx_00,arg,0x6d4);
      return;
    case 4:
      gen_mfc0_load32(tcg_ctx_00,arg,0x6d8);
      return;
    case 5:
      gen_mfc0_load32(tcg_ctx_00,arg,0x6e0);
      return;
    case 6:
      gen_mfc0_load32(tcg_ctx_00,arg,0x6e8);
      return;
    case 7:
      gen_mfc0_load32(tcg_ctx_00,arg,0x6ec);
      return;
    }
    break;
  case 0x11:
    if (sel == 0) {
      gen_helper_mfc0_lladdr(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
      return;
    }
    if (sel == 1) {
      if ((ctx->mrp & 1U) != 0) {
        gen_helper_mfc0_maar(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
        return;
      }
    }
    else if ((sel == 2) && ((ctx->mrp & 1U) != 0)) {
      gen_mfc0_load32(tcg_ctx_00,arg,0x778);
      return;
    }
    break;
  case 0x12:
    if (((uint)sel < 8) && ((ctx->CP0_Config1 & 8U) != 0)) {
      pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,sel);
      gen_helper_mfc0_watchlo(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,pTVar2);
      tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      return;
    }
    break;
  case 0x13:
    if (((uint)sel < 8) && ((ctx->CP0_Config1 & 8U) != 0)) {
      pTVar2 = tcg_const_i32_mips64el(tcg_ctx_00,sel);
      gen_helper_mfc0_watchhi(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,pTVar2);
      tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      return;
    }
    break;
  case 0x14:
    if (sel == 0) {
      check_insn(ctx,4);
      tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,0x830);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
      return;
    }
    break;
  case 0x15:
    if (((ctx->insn_flags & 0x2000) == 0) && (sel == 0)) {
      gen_mfc0_load32(tcg_ctx_00,arg,0x838);
      return;
    }
    break;
  case 0x16:
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,arg,0);
    return;
  case 0x17:
    switch(sel) {
    case 0:
      gen_helper_mfc0_debug(tcg_ctx_00,arg,tcg_ctx_00->cpu_env);
      return;
    case 1:
      break;
    case 2:
      break;
    case 3:
      break;
    case 4:
      break;
    case 5:
    }
    break;
  case 0x18:
    if (sel == 0) {
      tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,0x840);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
      return;
    }
    break;
  case 0x19:
    switch(sel) {
    case 0:
      gen_mfc0_load32(tcg_ctx_00,arg,0x848);
      return;
    case 1:
      break;
    case 2:
      break;
    case 3:
      break;
    case 4:
      break;
    case 5:
      break;
    case 6:
      break;
    case 7:
    }
    break;
  case 0x1a:
    if (sel == 0) {
      gen_mfc0_load32(tcg_ctx_00,arg,0x84c);
      return;
    }
    break;
  case 0x1b:
    if (sel == 0) {
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,arg,0);
      return;
    }
    break;
  case 0x1c:
    if (sel != 0) {
      if (sel != 1) {
        if (sel == 2) goto LAB_00d1010a;
        if (sel != 3) {
          if (sel == 4) goto LAB_00d1010a;
          if (sel != 5) {
            if (sel == 6) goto LAB_00d1010a;
            if (sel != 7) break;
          }
        }
      }
      gen_mfc0_load32(tcg_ctx_00,arg,0x858);
      return;
    }
LAB_00d1010a:
    pTVar3 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_ld_i64_mips64el(tcg_ctx_00,pTVar3,tcg_ctx_00->cpu_env,0x850);
    gen_move_low32(tcg_ctx_00,arg,pTVar3);
    tcg_temp_free_i64(tcg_ctx_00,pTVar3);
    return;
  case 0x1d:
    if (sel != 0) {
      if (sel != 1) {
        if (sel == 2) goto LAB_00d101dc;
        if (sel != 3) {
          if (sel == 4) goto LAB_00d101dc;
          if (sel != 5) {
            if (sel == 6) goto LAB_00d101dc;
            if (sel != 7) break;
          }
        }
      }
      gen_mfc0_load32(tcg_ctx_00,arg,0x860);
      return;
    }
LAB_00d101dc:
    gen_mfc0_load32(tcg_ctx_00,arg,0x85c);
    return;
  case 0x1e:
    if (sel == 0) {
      tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,0x868);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
      return;
    }
    break;
  case 0x1f:
    if (sel == 0) {
      gen_mfc0_load32(tcg_ctx_00,arg,0x870);
      return;
    }
    if ((sel - 2U < 6) && ((ctx->kscrexist & 1 << ((byte)sel & 0x1f)) != 0)) {
      tcg_gen_ld_i64_mips64el(tcg_ctx_00,arg,tcg_ctx_00->cpu_env,(long)(sel + -2) * 8 + 0x878);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx_00,arg,arg);
      return;
    }
  }
  gen_mfc0_unimplemented(ctx,arg);
  return;
}

Assistant:

static void gen_mfc0(DisasContext *ctx, TCGv arg, int reg, int sel)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    //const char *register_name = "invalid";

    if (sel != 0) {
        check_insn(ctx, ISA_MIPS32);
    }

    switch (reg) {
    case CP0_REGISTER_00:
        switch (sel) {
        case CP0_REG00__INDEX:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Index));
            //register_name = "Index";
            break;
        case CP0_REG00__MVPCONTROL:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_helper_mfc0_mvpcontrol(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "MVPControl";
            break;
        case CP0_REG00__MVPCONF0:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_helper_mfc0_mvpconf0(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "MVPConf0";
            break;
        case CP0_REG00__MVPCONF1:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_helper_mfc0_mvpconf1(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "MVPConf1";
            break;
        case CP0_REG00__VPCONTROL:
            CP0_CHECK(ctx->vp);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_VPControl));
            //register_name = "VPControl";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_01:
        switch (sel) {
        case CP0_REG01__RANDOM:
            CP0_CHECK(!(ctx->insn_flags & ISA_MIPS32R6));
            gen_helper_mfc0_random(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "Random";
            break;
        case CP0_REG01__VPECONTROL:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_VPEControl));
            //register_name = "VPEControl";
            break;
        case CP0_REG01__VPECONF0:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_VPEConf0));
            //register_name = "VPEConf0";
            break;
        case CP0_REG01__VPECONF1:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_VPEConf1));
            //register_name = "VPEConf1";
            break;
        case CP0_REG01__YQMASK:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_mfc0_load64(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_YQMask));
            //register_name = "YQMask";
            break;
        case CP0_REG01__VPESCHEDULE:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_mfc0_load64(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_VPESchedule));
            //register_name = "VPESchedule";
            break;
        case CP0_REG01__VPESCHEFBACK:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_mfc0_load64(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_VPEScheFBack));
            //register_name = "VPEScheFBack";
            break;
        case CP0_REG01__VPEOPT:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_VPEOpt));
            //register_name = "VPEOpt";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_02:
        switch (sel) {
        case CP0_REG02__ENTRYLO0:
            {
                TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
                tcg_gen_ld_i64(tcg_ctx, tmp, tcg_ctx->cpu_env,
                               offsetof(CPUMIPSState, CP0_EntryLo0));
#if defined(TARGET_MIPS64)
                if (ctx->rxi) {
                    /* Move RI/XI fields to bits 31:30 */
                    tcg_gen_shri_tl(tcg_ctx, arg, tmp, CP0EnLo_XI);
                    tcg_gen_deposit_tl(tcg_ctx, tmp, tmp, arg, 30, 2);
                }
#endif
                gen_move_low32(tcg_ctx, arg, tmp);
                tcg_temp_free_i64(tcg_ctx, tmp);
            }
            //register_name = "EntryLo0";
            break;
        case CP0_REG02__TCSTATUS:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_helper_mfc0_tcstatus(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "TCStatus";
            break;
        case CP0_REG02__TCBIND:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_helper_mfc0_tcbind(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "TCBind";
            break;
        case CP0_REG02__TCRESTART:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_helper_mfc0_tcrestart(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "TCRestart";
            break;
        case CP0_REG02__TCHALT:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_helper_mfc0_tchalt(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "TCHalt";
            break;
        case CP0_REG02__TCCONTEXT:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_helper_mfc0_tccontext(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "TCContext";
            break;
        case CP0_REG02__TCSCHEDULE:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_helper_mfc0_tcschedule(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "TCSchedule";
            break;
        case CP0_REG02__TCSCHEFBACK:
            CP0_CHECK(ctx->insn_flags & ASE_MT);
            gen_helper_mfc0_tcschefback(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "TCScheFBack";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_03:
        switch (sel) {
        case CP0_REG03__ENTRYLO1:
            {
                TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
                tcg_gen_ld_i64(tcg_ctx, tmp, tcg_ctx->cpu_env,
                               offsetof(CPUMIPSState, CP0_EntryLo1));
#if defined(TARGET_MIPS64)
                if (ctx->rxi) {
                    /* Move RI/XI fields to bits 31:30 */
                    tcg_gen_shri_tl(tcg_ctx, arg, tmp, CP0EnLo_XI);
                    tcg_gen_deposit_tl(tcg_ctx, tmp, tmp, arg, 30, 2);
                }
#endif
                gen_move_low32(tcg_ctx, arg, tmp);
                tcg_temp_free_i64(tcg_ctx, tmp);
            }
            //register_name = "EntryLo1";
            break;
        case CP0_REG03__GLOBALNUM:
            CP0_CHECK(ctx->vp);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_GlobalNumber));
            //register_name = "GlobalNumber";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_04:
        switch (sel) {
        case CP0_REG04__CONTEXT:
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_Context));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "Context";
            break;
        case CP0_REG04__CONTEXTCONFIG:
            /* SmartMIPS ASE */
            /* gen_helper_mfc0_contextconfig(tcg_ctx, arg); */
            //register_name = "ContextConfig";
            goto cp0_unimplemented;
        case CP0_REG04__USERLOCAL:
            CP0_CHECK(ctx->ulri);
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env,
                          offsetof(CPUMIPSState, active_tc.CP0_UserLocal));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "UserLocal";
            break;
        case CP0_REG04__MMID:
            CP0_CHECK(ctx->mi);
            gen_helper_mtc0_memorymapid(tcg_ctx, tcg_ctx->cpu_env, arg);
            //register_name = "MMID";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_05:
        switch (sel) {
        case CP0_REG05__PAGEMASK:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_PageMask));
            //register_name = "PageMask";
            break;
        case CP0_REG05__PAGEGRAIN:
            check_insn(ctx, ISA_MIPS32R2);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_PageGrain));
            //register_name = "PageGrain";
            break;
        case CP0_REG05__SEGCTL0:
            CP0_CHECK(ctx->sc);
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_SegCtl0));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "SegCtl0";
            break;
        case CP0_REG05__SEGCTL1:
            CP0_CHECK(ctx->sc);
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_SegCtl1));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "SegCtl1";
            break;
        case CP0_REG05__SEGCTL2:
            CP0_CHECK(ctx->sc);
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_SegCtl2));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "SegCtl2";
            break;
        case CP0_REG05__PWBASE:
            check_pw(ctx);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_PWBase));
            //register_name = "PWBase";
            break;
        case CP0_REG05__PWFIELD:
            check_pw(ctx);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_PWField));
            //register_name = "PWField";
            break;
        case CP0_REG05__PWSIZE:
            check_pw(ctx);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_PWSize));
            //register_name = "PWSize";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_06:
        switch (sel) {
        case CP0_REG06__WIRED:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Wired));
            //register_name = "Wired";
            break;
        case CP0_REG06__SRSCONF0:
            check_insn(ctx, ISA_MIPS32R2);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_SRSConf0));
            //register_name = "SRSConf0";
            break;
        case CP0_REG06__SRSCONF1:
            check_insn(ctx, ISA_MIPS32R2);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_SRSConf1));
            //register_name = "SRSConf1";
            break;
        case CP0_REG06__SRSCONF2:
            check_insn(ctx, ISA_MIPS32R2);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_SRSConf2));
            //register_name = "SRSConf2";
            break;
        case CP0_REG06__SRSCONF3:
            check_insn(ctx, ISA_MIPS32R2);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_SRSConf3));
            //register_name = "SRSConf3";
            break;
        case CP0_REG06__SRSCONF4:
            check_insn(ctx, ISA_MIPS32R2);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_SRSConf4));
            //register_name = "SRSConf4";
            break;
        case CP0_REG06__PWCTL:
            check_pw(ctx);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_PWCtl));
            //register_name = "PWCtl";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_07:
        switch (sel) {
        case CP0_REG07__HWRENA:
            check_insn(ctx, ISA_MIPS32R2);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_HWREna));
            //register_name = "HWREna";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_08:
        switch (sel) {
        case CP0_REG08__BADVADDR:
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_BadVAddr));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "BadVAddr";
            break;
        case CP0_REG08__BADINSTR:
            CP0_CHECK(ctx->bi);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_BadInstr));
            //register_name = "BadInstr";
            break;
        case CP0_REG08__BADINSTRP:
            CP0_CHECK(ctx->bp);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_BadInstrP));
            //register_name = "BadInstrP";
            break;
        case CP0_REG08__BADINSTRX:
            CP0_CHECK(ctx->bi);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_BadInstrX));
            tcg_gen_andi_tl(tcg_ctx, arg, arg, ~0xffff);
            //register_name = "BadInstrX";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_09:
        switch (sel) {
        case CP0_REG09__COUNT:
            /* Mark as an IO operation because we read the time.  */
            if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
                gen_io_start(tcg_ctx);
            }
            gen_helper_mfc0_count(tcg_ctx, arg, tcg_ctx->cpu_env);
            /*
             * Break the TB to be able to take timer interrupts immediately
             * after reading count. DISAS_STOP isn't sufficient, we need to
             * ensure we break completely out of translated code.
             */
            gen_save_pc(tcg_ctx, ctx->base.pc_next + 4);
            ctx->base.is_jmp = DISAS_EXIT;
            //register_name = "Count";
            break;
        case CP0_REG09__SAARI:
            CP0_CHECK(ctx->saar);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_SAARI));
            //register_name = "SAARI";
            break;
        case CP0_REG09__SAAR:
            CP0_CHECK(ctx->saar);
            gen_helper_mfc0_saar(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "SAAR";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_10:
        switch (sel) {
        case CP0_REG10__ENTRYHI:
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_EntryHi));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "EntryHi";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_11:
        switch (sel) {
        case CP0_REG11__COMPARE:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Compare));
            //register_name = "Compare";
            break;
        /* 6,7 are implementation dependent */
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_12:
        switch (sel) {
        case CP0_REG12__STATUS:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Status));
            //register_name = "Status";
            break;
        case CP0_REG12__INTCTL:
            check_insn(ctx, ISA_MIPS32R2);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_IntCtl));
            //register_name = "IntCtl";
            break;
        case CP0_REG12__SRSCTL:
            check_insn(ctx, ISA_MIPS32R2);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_SRSCtl));
            //register_name = "SRSCtl";
            break;
        case CP0_REG12__SRSMAP:
            check_insn(ctx, ISA_MIPS32R2);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_SRSMap));
            //register_name = "SRSMap";
            break;
        default:
            goto cp0_unimplemented;
       }
        break;
    case CP0_REGISTER_13:
        switch (sel) {
        case CP0_REG13__CAUSE:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Cause));
            //register_name = "Cause";
            break;
        default:
            goto cp0_unimplemented;
       }
        break;
    case CP0_REGISTER_14:
        switch (sel) {
        case CP0_REG14__EPC:
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_EPC));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "EPC";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_15:
        switch (sel) {
        case CP0_REG15__PRID:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_PRid));
            //register_name = "PRid";
            break;
        case CP0_REG15__EBASE:
            check_insn(ctx, ISA_MIPS32R2);
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_EBase));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "EBase";
            break;
        case CP0_REG15__CMGCRBASE:
            check_insn(ctx, ISA_MIPS32R2);
            CP0_CHECK(ctx->cmgcr);
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_CMGCRBase));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "CMGCRBase";
            break;
        default:
            goto cp0_unimplemented;
       }
        break;
    case CP0_REGISTER_16:
        switch (sel) {
        case CP0_REG16__CONFIG:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Config0));
            //register_name = "Config";
            break;
        case CP0_REG16__CONFIG1:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Config1));
            //register_name = "Config1";
            break;
        case CP0_REG16__CONFIG2:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Config2));
            //register_name = "Config2";
            break;
        case CP0_REG16__CONFIG3:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Config3));
            //register_name = "Config3";
            break;
        case CP0_REG16__CONFIG4:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Config4));
            //register_name = "Config4";
            break;
        case CP0_REG16__CONFIG5:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Config5));
            //register_name = "Config5";
            break;
        /* 6,7 are implementation dependent */
        case CP0_REG16__CONFIG6:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Config6));
            //register_name = "Config6";
            break;
        case CP0_REG16__CONFIG7:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Config7));
            //register_name = "Config7";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_17:
        switch (sel) {
        case CP0_REG17__LLADDR:
            gen_helper_mfc0_lladdr(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "LLAddr";
            break;
        case CP0_REG17__MAAR:
            CP0_CHECK(ctx->mrp);
            gen_helper_mfc0_maar(tcg_ctx, arg, tcg_ctx->cpu_env);
            //register_name = "MAAR";
            break;
        case CP0_REG17__MAARI:
            CP0_CHECK(ctx->mrp);
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_MAARI));
            //register_name = "MAARI";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_18:
        switch (sel) {
        case CP0_REG18__WATCHLO0:
        case CP0_REG18__WATCHLO1:
        case CP0_REG18__WATCHLO2:
        case CP0_REG18__WATCHLO3:
        case CP0_REG18__WATCHLO4:
        case CP0_REG18__WATCHLO5:
        case CP0_REG18__WATCHLO6:
        case CP0_REG18__WATCHLO7:
            CP0_CHECK(ctx->CP0_Config1 & (1 << CP0C1_WR));
            gen_helper_1e0i(mfc0_watchlo, arg, sel);
            //register_name = "WatchLo";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_19:
        switch (sel) {
        case CP0_REG19__WATCHHI0:
        case CP0_REG19__WATCHHI1:
        case CP0_REG19__WATCHHI2:
        case CP0_REG19__WATCHHI3:
        case CP0_REG19__WATCHHI4:
        case CP0_REG19__WATCHHI5:
        case CP0_REG19__WATCHHI6:
        case CP0_REG19__WATCHHI7:
            CP0_CHECK(ctx->CP0_Config1 & (1 << CP0C1_WR));
            gen_helper_1e0i(mfc0_watchhi, arg, sel);
            //register_name = "WatchHi";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_20:
        switch (sel) {
        case CP0_REG20__XCONTEXT:
#if defined(TARGET_MIPS64)
            check_insn(ctx, ISA_MIPS3);
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_XContext));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "XContext";
            break;
#endif
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_21:
       /* Officially reserved, but sel 0 is used for R1x000 framemask */
        CP0_CHECK(!(ctx->insn_flags & ISA_MIPS32R6));
        switch (sel) {
        case 0:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Framemask));
            //register_name = "Framemask";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_22:
        tcg_gen_movi_tl(tcg_ctx, arg, 0); /* unimplemented */
        //register_name = "'Diagnostic"; /* implementation dependent */
        break;
    case CP0_REGISTER_23:
        switch (sel) {
        case CP0_REG23__DEBUG:
            gen_helper_mfc0_debug(tcg_ctx, arg, tcg_ctx->cpu_env); /* EJTAG support */
            //register_name = "Debug";
            break;
        case CP0_REG23__TRACECONTROL:
            /* PDtrace support */
            /* gen_helper_mfc0_tracecontrol(tcg_ctx, arg);  */
            //register_name = "TraceControl";
            goto cp0_unimplemented;
        case CP0_REG23__TRACECONTROL2:
            /* PDtrace support */
            /* gen_helper_mfc0_tracecontrol2(tcg_ctx, arg); */
            //register_name = "TraceControl2";
            goto cp0_unimplemented;
        case CP0_REG23__USERTRACEDATA1:
            /* PDtrace support */
            /* gen_helper_mfc0_usertracedata1(tcg_ctx, arg);*/
            //register_name = "UserTraceData1";
            goto cp0_unimplemented;
        case CP0_REG23__TRACEIBPC:
            /* PDtrace support */
            /* gen_helper_mfc0_traceibpc(tcg_ctx, arg);     */
            //register_name = "TraceIBPC";
            goto cp0_unimplemented;
        case CP0_REG23__TRACEDBPC:
            /* PDtrace support */
            /* gen_helper_mfc0_tracedbpc(tcg_ctx, arg);     */
            //register_name = "TraceDBPC";
            goto cp0_unimplemented;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_24:
        switch (sel) {
        case CP0_REG24__DEPC:
            /* EJTAG support */
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_DEPC));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "DEPC";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_25:
        switch (sel) {
        case CP0_REG25__PERFCTL0:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_Performance0));
            //register_name = "Performance0";
            break;
        case CP0_REG25__PERFCNT0:
            /* gen_helper_mfc0_performance1(tcg_ctx, arg); */
            //register_name = "Performance1";
            goto cp0_unimplemented;
        case CP0_REG25__PERFCTL1:
            /* gen_helper_mfc0_performance2(tcg_ctx, arg); */
            //register_name = "Performance2";
            goto cp0_unimplemented;
        case CP0_REG25__PERFCNT1:
            /* gen_helper_mfc0_performance3(tcg_ctx, arg); */
            //register_name = "Performance3";
            goto cp0_unimplemented;
        case CP0_REG25__PERFCTL2:
            /* gen_helper_mfc0_performance4(tcg_ctx, arg); */
            //register_name = "Performance4";
            goto cp0_unimplemented;
        case CP0_REG25__PERFCNT2:
            /* gen_helper_mfc0_performance5(tcg_ctx, arg); */
            //register_name = "Performance5";
            goto cp0_unimplemented;
        case CP0_REG25__PERFCTL3:
            /* gen_helper_mfc0_performance6(tcg_ctx, arg); */
            //register_name = "Performance6";
            goto cp0_unimplemented;
        case CP0_REG25__PERFCNT3:
            /* gen_helper_mfc0_performance7(tcg_ctx, arg); */
            //register_name = "Performance7";
            goto cp0_unimplemented;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_26:
        switch (sel) {
        case CP0_REG26__ERRCTL:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_ErrCtl));
            //register_name = "ErrCtl";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_27:
        switch (sel) {
        case CP0_REG27__CACHERR:
            tcg_gen_movi_tl(tcg_ctx, arg, 0); /* unimplemented */
            //register_name = "CacheErr";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_28:
        switch (sel) {
        case CP0_REG28__TAGLO:
        case CP0_REG28__TAGLO1:
        case CP0_REG28__TAGLO2:
        case CP0_REG28__TAGLO3:
            {
                TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
                tcg_gen_ld_i64(tcg_ctx, tmp, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_TagLo));
                gen_move_low32(tcg_ctx, arg, tmp);
                tcg_temp_free_i64(tcg_ctx, tmp);
            }
            //register_name = "TagLo";
            break;
        case CP0_REG28__DATALO:
        case CP0_REG28__DATALO1:
        case CP0_REG28__DATALO2:
        case CP0_REG28__DATALO3:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_DataLo));
            //register_name = "DataLo";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_29:
        switch (sel) {
        case CP0_REG29__TAGHI:
        case CP0_REG29__TAGHI1:
        case CP0_REG29__TAGHI2:
        case CP0_REG29__TAGHI3:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_TagHi));
            //register_name = "TagHi";
            break;
        case CP0_REG29__DATAHI:
        case CP0_REG29__DATAHI1:
        case CP0_REG29__DATAHI2:
        case CP0_REG29__DATAHI3:
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_DataHi));
            //register_name = "DataHi";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_30:
        switch (sel) {
        case CP0_REG30__ERROREPC:
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env, offsetof(CPUMIPSState, CP0_ErrorEPC));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "ErrorEPC";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    case CP0_REGISTER_31:
        switch (sel) {
        case CP0_REG31__DESAVE:
            /* EJTAG support */
            gen_mfc0_load32(tcg_ctx, arg, offsetof(CPUMIPSState, CP0_DESAVE));
            //register_name = "DESAVE";
            break;
        case CP0_REG31__KSCRATCH1:
        case CP0_REG31__KSCRATCH2:
        case CP0_REG31__KSCRATCH3:
        case CP0_REG31__KSCRATCH4:
        case CP0_REG31__KSCRATCH5:
        case CP0_REG31__KSCRATCH6:
            CP0_CHECK(ctx->kscrexist & (1 << sel));
            tcg_gen_ld_tl(tcg_ctx, arg, tcg_ctx->cpu_env,
                          offsetof(CPUMIPSState, CP0_KScratch[sel - 2]));
            tcg_gen_ext32s_tl(tcg_ctx, arg, arg);
            //register_name = "KScratch";
            break;
        default:
            goto cp0_unimplemented;
        }
        break;
    default:
       goto cp0_unimplemented;
    }
    return;

cp0_unimplemented:
    //qemu_log_mask(LOG_UNIMP, "mfc0 %s (reg %d sel %d)\n",
                  //register_name, reg, sel);
    gen_mfc0_unimplemented(ctx, arg);
}